

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesGroupInfo.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XercesGroupInfo::serialize(XercesGroupInfo *this,XSerializeEngine *serEng)

{
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  
  if (serEng->fStoreLoad != 0) {
    XSerializeEngine::operator>>(serEng,&this->fCheckElementConsistency);
    XSerializeEngine::operator>>(serEng,&this->fScope);
    XSerializeEngine::operator>>(serEng,&this->fNameId);
    XSerializeEngine::operator>>(serEng,&this->fNamespaceId);
    xercesc_4_0::operator>>(serEng,&this->fContentSpec);
    XTemplateSerializer::loadObject(&this->fElements,4,false,serEng);
    xercesc_4_0::operator>>(serEng,&this->fBaseGroup);
    this->fLocator = (XSDLocator *)0x0;
    return;
  }
  XSerializeEngine::operator<<(serEng,this->fCheckElementConsistency);
  XSerializeEngine::operator<<(serEng,this->fScope);
  XSerializeEngine::operator<<(serEng,this->fNameId);
  XSerializeEngine::operator<<(serEng,this->fNamespaceId);
  XSerializeEngine::write(serEng,(int)this->fContentSpec,__buf,in_RCX);
  XTemplateSerializer::storeObject(this->fElements,serEng);
  XSerializeEngine::write(serEng,(int)this->fBaseGroup,__buf_00,in_RCX);
  return;
}

Assistant:

void XercesGroupInfo::serialize(XSerializeEngine& serEng)
{
    if (serEng.isStoring())
    {   
        serEng<<fCheckElementConsistency;
        serEng<<fScope;
        serEng<<fNameId;
        serEng<<fNamespaceId;
        serEng<<fContentSpec;

        /***
         *
         * Serialize RefVectorOf<SchemaElementDecl>* fElements;
         *
         ***/

        XTemplateSerializer::storeObject(fElements, serEng);

        serEng<<fBaseGroup;

        //don't serialize     XSDLocator* fLocator;
    }
    else
    {
        serEng>>fCheckElementConsistency;
        serEng>>fScope;
        serEng>>fNameId;
        serEng>>fNamespaceId;
        serEng>>fContentSpec;

        /***
         * 
         * Deserialize RefVectorOf<SchemaElementDecl>*    fElements;
         *
         ***/
        XTemplateSerializer::loadObject(&fElements, 4, false, serEng);

        serEng>>fBaseGroup;

        //don't serialize     XSDLocator* fLocator;
        fLocator = 0;
    }

}